

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::InfoParser::ProcessLine(InfoParser *this)

{
  char *pcVar1;
  bool bVar2;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexCheckOut,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexCheckOut).regmatch);
  if (bVar2) {
    pcVar1 = (this->RegexCheckOut).regmatch.startp[1];
    if (pcVar1 == (char *)0x0) {
      local_30 = &local_20;
      local_28 = 0;
      local_20 = 0;
    }
    else {
      local_30 = &local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,pcVar1,(this->RegexCheckOut).regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)&this->BZR->URL,(string *)&local_30);
    if (local_30 != &local_20) {
      operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
    }
    this->CheckOutFound = true;
  }
  else if (this->CheckOutFound == false) {
    bVar2 = cmsys::RegularExpression::find
                      (&this->RegexParent,(this->super_LineParser).Line._M_dataplus._M_p,
                       &(this->RegexParent).regmatch);
    if (bVar2) {
      pcVar1 = (this->RegexParent).regmatch.startp[1];
      if (pcVar1 == (char *)0x0) {
        local_30 = &local_20;
        local_28 = 0;
        local_20 = 0;
      }
      else {
        local_30 = &local_20;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_30,pcVar1,(this->RegexParent).regmatch.endp[1]);
      }
      std::__cxx11::string::operator=((string *)&this->BZR->URL,(string *)&local_30);
      if (local_30 != &local_20) {
        operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
      }
    }
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexCheckOut.find(this->Line)) {
      this->BZR->URL = this->RegexCheckOut.match(1);
      this->CheckOutFound = true;
    } else if (!this->CheckOutFound && this->RegexParent.find(this->Line)) {
      this->BZR->URL = this->RegexParent.match(1);
    }
    return true;
  }